

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O3

_Bool do_vfm_sp(DisasContext_conflict1 *s,arg_VFMA_sp *a,_Bool neg_n,_Bool neg_d)

{
  TCGContext_conflict1 *s_00;
  _Bool _Var1;
  TCGTemp *pTVar2;
  TCGv_i32 var;
  TCGTemp *pTVar3;
  TCGv_i32 var_00;
  TCGv_ptr pTVar4;
  _Bool _Var5;
  uintptr_t o_2;
  uintptr_t o;
  TCGTemp *args [1];
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  if ((((s->isar->mvfr1 < 0x10000000) || ((s->isar->mvfr0 & 0xf0) == 0)) || (s->vec_len != 0)) ||
     (s->vec_stride != 0)) {
    _Var5 = false;
  }
  else {
    s_00 = s->uc->tcg_ctx;
    _Var1 = full_vfp_access_check(s,false);
    _Var5 = true;
    if (_Var1) {
      pTVar2 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
      var = (TCGv_i32)((long)pTVar2 - (long)s_00);
      pTVar2 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
      pTVar3 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
      var_00 = (TCGv_i32)((long)pTVar3 - (long)s_00);
      neon_load_reg32(s_00,var,a->vn);
      neon_load_reg32(s_00,(TCGv_i32)((long)pTVar2 - (long)s_00),a->vm);
      if (neg_n) {
        local_58 = (TCGTemp *)((long)s_00 + (long)var);
        tcg_gen_callN_aarch64(s_00,helper_vfp_negs_aarch64,local_58,1,&local_58);
      }
      neon_load_reg32(s_00,var_00,a->vd);
      if (neg_d) {
        local_58 = (TCGTemp *)((long)s_00 + (long)var_00);
        tcg_gen_callN_aarch64(s_00,helper_vfp_negs_aarch64,local_58,1,&local_58);
      }
      pTVar4 = get_fpstatus_ptr_aarch64(s_00,0);
      pTVar3 = (TCGTemp *)((TCGv_i32)((long)pTVar2 - (long)s_00) + (long)s_00);
      pTVar2 = (TCGTemp *)((long)s_00 + (long)var_00);
      local_58 = (TCGTemp *)(var + (long)s_00);
      local_50 = pTVar3;
      local_48 = pTVar2;
      local_40 = (TCGTemp *)(pTVar4 + (long)s_00);
      tcg_gen_callN_aarch64(s_00,helper_vfp_muladds_aarch64,pTVar2,4,&local_58);
      neon_store_reg32(s_00,var_00,a->vd);
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar4 + (long)s_00));
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(var + (long)s_00));
      tcg_temp_free_internal_aarch64(s_00,pTVar3);
      tcg_temp_free_internal_aarch64(s_00,pTVar2);
    }
  }
  return _Var5;
}

Assistant:

static bool do_vfm_sp(DisasContext *s, arg_VFMA_sp *a, bool neg_n, bool neg_d)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    /*
     * VFNMA : fd = muladd(-fd,  fn, fm)
     * VFNMS : fd = muladd(-fd, -fn, fm)
     * VFMA  : fd = muladd( fd,  fn, fm)
     * VFMS  : fd = muladd( fd, -fn, fm)
     *
     * These are fused multiply-add, and must be done as one floating
     * point operation with no rounding between the multiplication and
     * addition steps.  NB that doing the negations here as separate
     * steps is correct : an input NaN should come out with its sign
     * bit flipped if it is a negated-input.
     */
    TCGv_ptr fpst;
    TCGv_i32 vn, vm, vd;

    /*
     * Present in VFPv4 only.
     * Note that we can't rely on the SIMDFMAC check alone, because
     * in a Neon-no-VFP core that ID register field will be non-zero.
     */
    if (!dc_isar_feature(aa32_simdfmac, s) ||
        !dc_isar_feature(aa32_fpsp_v2, s)) {
        return false;
    }
    /*
     * In v7A, UNPREDICTABLE with non-zero vector length/stride; from
     * v8A, must UNDEF. We choose to UNDEF for both v7A and v8A.
     */
    if (s->vec_len != 0 || s->vec_stride != 0) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    vn = tcg_temp_new_i32(tcg_ctx);
    vm = tcg_temp_new_i32(tcg_ctx);
    vd = tcg_temp_new_i32(tcg_ctx);

    neon_load_reg32(tcg_ctx, vn, a->vn);
    neon_load_reg32(tcg_ctx, vm, a->vm);
    if (neg_n) {
        /* VFNMS, VFMS */
        gen_helper_vfp_negs(tcg_ctx, vn, vn);
    }
    neon_load_reg32(tcg_ctx, vd, a->vd);
    if (neg_d) {
        /* VFNMA, VFNMS */
        gen_helper_vfp_negs(tcg_ctx, vd, vd);
    }
    fpst = get_fpstatus_ptr(tcg_ctx, 0);
    gen_helper_vfp_muladds(tcg_ctx, vd, vn, vm, vd, fpst);
    neon_store_reg32(tcg_ctx, vd, a->vd);

    tcg_temp_free_ptr(tcg_ctx, fpst);
    tcg_temp_free_i32(tcg_ctx, vn);
    tcg_temp_free_i32(tcg_ctx, vm);
    tcg_temp_free_i32(tcg_ctx, vd);

    return true;
}